

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicObject.cpp
# Opt level: O3

bool __thiscall Js::DynamicObject::DeoptimizeObjectHeaderInlining(DynamicObject *this)

{
  Type *addr;
  ushort newInlineSlotCapacity;
  bool bVar1;
  bool bVar2;
  int iVar3;
  PathTypeHandlerBase *pPVar4;
  undefined4 extraout_var;
  DynamicType *this_00;
  
  bVar1 = DynamicTypeHandler::IsObjectHeaderInlinedTypeHandler
                    (*(DynamicTypeHandler **)((this->super_RecyclableObject).type.ptr + 1));
  if (bVar1) {
    addr = &(this->super_RecyclableObject).type;
    bVar2 = Phases::IsEnabled((Phases *)&DAT_015b6718,ObjectHeaderInliningPhase);
    if (bVar2) {
      Output::Print(L"ObjectHeaderInlining: De-optimizing the object.\n");
      Output::Flush();
    }
    pPVar4 = PathTypeHandlerBase::FromTypeHandler
                       (*(DynamicTypeHandler **)((this->super_RecyclableObject).type.ptr + 1));
    pPVar4 = PathTypeHandlerBase::DeoptimizeObjectHeaderInlining
                       (pPVar4,(((this->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr);
    newInlineSlotCapacity = (pPVar4->super_DynamicTypeHandler).inlineSlotCapacity;
    DynamicTypeHandler::AdjustSlots
              (this,newInlineSlotCapacity,
               (pPVar4->super_DynamicTypeHandler).slotCapacity - (uint)newInlineSlotCapacity);
    iVar3 = (*(this->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x67])(this);
    this_00 = (DynamicType *)CONCAT44(extraout_var,iVar3);
    Memory::Recycler::WBSetBit((char *)&this_00->typeHandler);
    (this_00->typeHandler).ptr = &pPVar4->super_DynamicTypeHandler;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&this_00->typeHandler);
    DynamicType::ShareType(this_00);
    Memory::Recycler::WBSetBit((char *)addr);
    (this->super_RecyclableObject).type.ptr = (Type *)this_00;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  }
  return bVar1;
}

Assistant:

bool DynamicObject::DeoptimizeObjectHeaderInlining()
    {
        if(!IsObjectHeaderInlinedTypeHandler())
        {
            return false;
        }

        if (PHASE_TRACE1(Js::ObjectHeaderInliningPhase))
        {
            Output::Print(_u("ObjectHeaderInlining: De-optimizing the object.\n"));
            Output::Flush();
        }

        PathTypeHandlerBase *const oldTypeHandler = PathTypeHandlerBase::FromTypeHandler(GetTypeHandler());
        PathTypeHandlerBase *const newTypeHandler = oldTypeHandler->DeoptimizeObjectHeaderInlining(GetLibrary());

        const PropertyIndex newInlineSlotCapacity = newTypeHandler->GetInlineSlotCapacity();
        DynamicTypeHandler::AdjustSlots(
            this,
            newInlineSlotCapacity,
            newTypeHandler->GetSlotCapacity() - newInlineSlotCapacity);

        DynamicType *const newType = DuplicateType();
        newType->typeHandler = newTypeHandler;
        newType->ShareType();
        type = newType;
        return true;
    }